

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::AttributeTranslator::AttributeTranslator(AttributeTranslator *this)

{
  unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
  *in_RDI;
  
  std::unique_ptr<arangodb::velocypack::Builder,std::default_delete<arangodb::velocypack::Builder>>
  ::unique_ptr<std::default_delete<arangodb::velocypack::Builder>,void>(in_RDI);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
                   *)0x106856);
  std::
  unordered_map<unsigned_long,_const_unsigned_char_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>_>
  ::unordered_map((unordered_map<unsigned_long,_const_unsigned_char_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>_>
                   *)0x106864);
  in_RDI[0xf]._M_t.
  super___uniq_ptr_impl<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
  ._M_t.
  super__Tuple_impl<0UL,_arangodb::velocypack::Builder_*,_std::default_delete<arangodb::velocypack::Builder>_>
  .super__Head_base<0UL,_arangodb::velocypack::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  return;
}

Assistant:

AttributeTranslator::AttributeTranslator() : _count(0) {}